

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int64 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this)

{
  long in_RDI;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_8 = 0;
  }
  else {
    local_8 = ftell(*(FILE **)(in_RDI + 8));
  }
  return local_8;
}

Assistant:

int64 MkvWriter::Position() const {
  if (!file_)
    return 0;

#ifdef _MSC_VER
  return _ftelli64(file_);
#else
  return ftell(file_);
#endif
}